

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_0::AttributeGroup::init
          (AttributeGroup *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  DrawTest *pDVar1;
  OutputType type;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  undefined8 extraout_RDX_00;
  long lVar3;
  DrawTestSpec local_180;
  undefined8 local_130;
  IOPair iopairs [4];
  string desc;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pDVar1 = (DrawTest *)operator_new(0x138);
  deqp::gls::DrawTest::DrawTest
            (pDVar1,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,"single_attribute",
             "Single attribute array.");
  deqp::gls::DrawTestSpec::DrawTestSpec(&local_180);
  local_180.apiType.m_bits = 0x13;
  local_180.primitive = this->m_primitive;
  local_180.primitiveCount = 5;
  local_180.drawMethod = this->m_method;
  local_180.indexType = this->m_indexType;
  local_180.indexPointerOffset = 0;
  local_180.indexStorage = this->m_indexStorage;
  local_180.first = 0;
  local_180.indexMin = 0;
  local_180.indexMax = 0;
  local_180.instanceCount = 1;
  local_180.indirectOffset = 0;
  std::
  vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::resize(&local_180.attribs,1);
  (local_180.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->inputType = INPUTTYPE_FLOAT;
  (local_180.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->outputType = OUTPUTTYPE_VEC2;
  *(undefined1 **)
   &(local_180.attribs.
     super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
     ._M_impl.super__Vector_impl_data._M_start)->storage = &DAT_100000001;
  (local_180.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->componentCount = 2;
  (local_180.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->instanceDivisor = 0;
  (local_180.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->useDefaultAttribute = false;
  (local_180.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->normalize = false;
  (local_180.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->offset = 0;
  (local_180.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->stride = 0;
  addTestIterations(pDVar1,&local_180,TYPE_DRAW_COUNT);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar1);
  std::
  _Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::~_Vector_base(&local_180.attribs.
                   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                 );
  pDVar1 = (DrawTest *)operator_new(0x138);
  deqp::gls::DrawTest::DrawTest
            (pDVar1,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,"multiple_attributes",
             "Multiple attribute arrays.");
  deqp::gls::DrawTestSpec::DrawTestSpec(&local_180);
  local_180.apiType.m_bits = 0x13;
  local_180.primitive = this->m_primitive;
  local_180.primitiveCount = 5;
  local_180.drawMethod = this->m_method;
  local_180.indexType = this->m_indexType;
  local_180.indexPointerOffset = 0;
  local_180.indexStorage = this->m_indexStorage;
  local_180.first = 0;
  local_180.indexMin = 0;
  local_180.indexMax = 0;
  local_180.instanceCount = 1;
  local_180.indirectOffset = 0;
  std::
  vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::resize(&local_180.attribs,2);
  (local_180.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->inputType = INPUTTYPE_FLOAT;
  (local_180.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->outputType = OUTPUTTYPE_VEC2;
  *(undefined1 **)
   &(local_180.attribs.
     super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
     ._M_impl.super__Vector_impl_data._M_start)->storage = &DAT_100000001;
  (local_180.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->componentCount = 4;
  (local_180.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->instanceDivisor = 0;
  (local_180.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->useDefaultAttribute = false;
  (local_180.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->offset = 0;
  (local_180.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->stride = 0;
  (local_180.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->normalize = false;
  local_180.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].inputType = INPUTTYPE_FLOAT;
  local_180.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].outputType = OUTPUTTYPE_VEC2;
  *(undefined1 **)
   &local_180.attribs.
    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
    ._M_impl.super__Vector_impl_data._M_start[1].storage = &DAT_100000001;
  local_180.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].componentCount = 2;
  local_180.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].instanceDivisor = 0;
  local_180.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].useDefaultAttribute = false;
  local_180.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].normalize = false;
  local_180.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].offset = 0;
  local_180.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].stride = 0;
  addTestIterations(pDVar1,&local_180,TYPE_DRAW_COUNT);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar1);
  std::
  _Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::~_Vector_base(&local_180.attribs.
                   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                 );
  pDVar1 = (DrawTest *)operator_new(0x138);
  deqp::gls::DrawTest::DrawTest
            (pDVar1,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,"instanced_attributes",
             "Instanced attribute array.");
  deqp::gls::DrawTestSpec::DrawTestSpec(&local_180);
  local_180.apiType.m_bits = 0x13;
  local_180.primitive = this->m_primitive;
  local_180.primitiveCount = 5;
  local_180.drawMethod = this->m_method;
  local_180.indexType = this->m_indexType;
  local_180.indexPointerOffset = 0;
  local_180.indexStorage = this->m_indexStorage;
  local_180.first = 0;
  local_180.indexMin = 0;
  local_180.indexMax = 0;
  local_180.instanceCount = 1;
  local_180.indirectOffset = 0;
  std::
  vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::resize(&local_180.attribs,3);
  (local_180.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->inputType = INPUTTYPE_FLOAT;
  (local_180.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->outputType = OUTPUTTYPE_VEC2;
  *(undefined1 **)
   &(local_180.attribs.
     super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
     ._M_impl.super__Vector_impl_data._M_start)->storage = &DAT_100000001;
  (local_180.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->componentCount = 4;
  (local_180.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->instanceDivisor = 0;
  (local_180.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->useDefaultAttribute = false;
  (local_180.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->offset = 0;
  (local_180.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->stride = 0;
  (local_180.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->normalize = false;
  local_180.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].inputType = INPUTTYPE_FLOAT;
  local_180.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].outputType = OUTPUTTYPE_VEC2;
  *(undefined1 **)
   &local_180.attribs.
    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
    ._M_impl.super__Vector_impl_data._M_start[1].storage = &DAT_100000001;
  local_180.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].componentCount = 2;
  local_180.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].normalize = false;
  local_180.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].offset = 0;
  local_180.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].stride = 0;
  local_180.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].instanceDivisor = 1;
  local_180.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].useDefaultAttribute = false;
  local_180.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].additionalPositionAttribute = true;
  local_180.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[2].inputType = INPUTTYPE_FLOAT;
  local_180.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[2].outputType = OUTPUTTYPE_VEC2;
  *(undefined1 **)
   &local_180.attribs.
    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
    ._M_impl.super__Vector_impl_data._M_start[2].storage = &DAT_100000001;
  local_180.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[2].componentCount = 3;
  local_180.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[2].offset = 0;
  local_180.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[2].stride = 0;
  local_180.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[2].normalize = false;
  local_180.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[2].instanceDivisor = 1;
  local_180.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[2].useDefaultAttribute = false;
  addTestIterations(pDVar1,&local_180,TYPE_INSTANCE_COUNT);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar1);
  std::
  _Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::~_Vector_base(&local_180.attribs.
                   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                 );
  pDVar1 = (DrawTest *)operator_new(0x138);
  deqp::gls::DrawTest::DrawTest
            (pDVar1,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,"default_attribute",
             "Attribute specified with glVertexAttrib*.");
  deqp::gls::DrawTestSpec::DrawTestSpec(&local_180);
  local_180.apiType.m_bits = 0x13;
  local_180.primitive = this->m_primitive;
  local_180.primitiveCount = 5;
  local_180.drawMethod = this->m_method;
  local_180.indexType = this->m_indexType;
  local_180.indexPointerOffset = 0;
  local_180.indexStorage = this->m_indexStorage;
  local_180.first = 0;
  local_180.indexMin = 0;
  local_180.indexMax = 0;
  local_180.instanceCount = 1;
  local_180.indirectOffset = 0;
  local_130 = this;
  std::
  vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::resize(&local_180.attribs,2);
  (local_180.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->inputType = INPUTTYPE_FLOAT;
  (local_180.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->outputType = OUTPUTTYPE_VEC2;
  *(undefined1 **)
   &(local_180.attribs.
     super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
     ._M_impl.super__Vector_impl_data._M_start)->storage = &DAT_100000001;
  (local_180.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->componentCount = 2;
  (local_180.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->instanceDivisor = 0;
  (local_180.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->useDefaultAttribute = false;
  (local_180.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->offset = 0;
  (local_180.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->stride = 0;
  (local_180.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->normalize = false;
  iopairs[2].componentCount = 4;
  iopairs[3].input = INPUTTYPE_UNSIGNED_INT;
  iopairs[3].output = OUTPUTTYPE_UVEC2;
  iopairs[3].componentCount = 4;
  iopairs[1].output = OUTPUTTYPE_VEC4;
  iopairs[1].componentCount = 2;
  iopairs[2].input = INPUTTYPE_INT;
  iopairs[2].output = OUTPUTTYPE_IVEC3;
  iopairs[0].input = INPUTTYPE_FLOAT;
  iopairs[0].output = OUTPUTTYPE_VEC2;
  iopairs[0].componentCount = 4;
  iopairs[1].input = INPUTTYPE_FLOAT;
  uVar2 = extraout_RDX;
  for (lVar3 = 8; lVar3 != 0x38; lVar3 = lVar3 + 0xc) {
    deqp::gls::DrawTestSpec::inputTypeToString_abi_cxx11_
              (&local_90,(DrawTestSpec *)(ulong)*(uint *)((long)iopairs + lVar3 + -8),
               (InputType)uVar2);
    de::toString<int>(&local_b0,(int *)((long)&iopairs[0].input + lVar3));
    std::operator+(&local_70,&local_90,&local_b0);
    std::operator+(&local_50,&local_70," to ");
    deqp::gls::DrawTestSpec::outputTypeToString_abi_cxx11_
              (&local_d0,(DrawTestSpec *)(ulong)*(uint *)((long)iopairs + lVar3 + -4),type);
    std::operator+(&desc,&local_50,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    uVar2 = *(undefined8 *)((long)iopairs + lVar3 + -8);
    local_180.attribs.
    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
    ._M_impl.super__Vector_impl_data._M_start[1].inputType = (int)uVar2;
    local_180.attribs.
    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
    ._M_impl.super__Vector_impl_data._M_start[1].outputType = (int)((ulong)uVar2 >> 0x20);
    *(undefined1 **)
     &local_180.attribs.
      super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
      ._M_impl.super__Vector_impl_data._M_start[1].storage = &DAT_100000001;
    local_180.attribs.
    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
    ._M_impl.super__Vector_impl_data._M_start[1].componentCount =
         *(int *)((long)&iopairs[0].input + lVar3);
    local_180.attribs.
    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
    ._M_impl.super__Vector_impl_data._M_start[1].instanceDivisor = 0;
    local_180.attribs.
    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
    ._M_impl.super__Vector_impl_data._M_start[1].offset = 0;
    local_180.attribs.
    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
    ._M_impl.super__Vector_impl_data._M_start[1].stride = 0;
    local_180.attribs.
    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
    ._M_impl.super__Vector_impl_data._M_start[1].normalize = false;
    local_180.attribs.
    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
    ._M_impl.super__Vector_impl_data._M_start[1].useDefaultAttribute = true;
    deqp::gls::DrawTest::addIteration(pDVar1,&local_180,desc._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&desc);
    uVar2 = extraout_RDX_00;
  }
  tcu::TestNode::addChild((TestNode *)local_130,(TestNode *)pDVar1);
  std::
  _Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::~_Vector_base(&local_180.attribs.
                   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                 );
  return extraout_EAX;
}

Assistant:

void AttributeGroup::init (void)
{
	// Single attribute
	{
		gls::DrawTest*		test				= new gls::DrawTest(m_testCtx, m_context.getRenderContext(), "single_attribute", "Single attribute array.");
		gls::DrawTestSpec	spec;

		spec.apiType							= glu::ApiType::es(3,1);
		spec.primitive							= m_primitive;
		spec.primitiveCount						= 5;
		spec.drawMethod							= m_method;
		spec.indexType							= m_indexType;
		spec.indexPointerOffset					= 0;
		spec.indexStorage						= m_indexStorage;
		spec.first								= 0;
		spec.indexMin							= 0;
		spec.indexMax							= 0;
		spec.instanceCount						= 1;
		spec.indirectOffset						= 0;

		spec.attribs.resize(1);

		spec.attribs[0].inputType				= gls::DrawTestSpec::INPUTTYPE_FLOAT;
		spec.attribs[0].outputType				= gls::DrawTestSpec::OUTPUTTYPE_VEC2;
		spec.attribs[0].storage					= gls::DrawTestSpec::STORAGE_BUFFER;
		spec.attribs[0].usage					= gls::DrawTestSpec::USAGE_STATIC_DRAW;
		spec.attribs[0].componentCount			= 2;
		spec.attribs[0].offset					= 0;
		spec.attribs[0].stride					= 0;
		spec.attribs[0].normalize				= false;
		spec.attribs[0].instanceDivisor			= 0;
		spec.attribs[0].useDefaultAttribute		= false;

		addTestIterations(test, spec, TYPE_DRAW_COUNT);

		this->addChild(test);
	}

	// Multiple attribute
	{
		gls::DrawTest*		test				= new gls::DrawTest(m_testCtx, m_context.getRenderContext(), "multiple_attributes", "Multiple attribute arrays.");
		gls::DrawTestSpec	spec;

		spec.apiType							= glu::ApiType::es(3,1);
		spec.primitive							= m_primitive;
		spec.primitiveCount						= 5;
		spec.drawMethod							= m_method;
		spec.indexType							= m_indexType;
		spec.indexPointerOffset					= 0;
		spec.indexStorage						= m_indexStorage;
		spec.first								= 0;
		spec.indexMin							= 0;
		spec.indexMax							= 0;
		spec.instanceCount						= 1;
		spec.indirectOffset						= 0;

		spec.attribs.resize(2);

		spec.attribs[0].inputType				= gls::DrawTestSpec::INPUTTYPE_FLOAT;
		spec.attribs[0].outputType				= gls::DrawTestSpec::OUTPUTTYPE_VEC2;
		spec.attribs[0].storage					= gls::DrawTestSpec::STORAGE_BUFFER;
		spec.attribs[0].usage					= gls::DrawTestSpec::USAGE_STATIC_DRAW;
		spec.attribs[0].componentCount			= 4;
		spec.attribs[0].offset					= 0;
		spec.attribs[0].stride					= 0;
		spec.attribs[0].normalize				= false;
		spec.attribs[0].instanceDivisor			= 0;
		spec.attribs[0].useDefaultAttribute		= false;

		spec.attribs[1].inputType				= gls::DrawTestSpec::INPUTTYPE_FLOAT;
		spec.attribs[1].outputType				= gls::DrawTestSpec::OUTPUTTYPE_VEC2;
		spec.attribs[1].storage					= gls::DrawTestSpec::STORAGE_BUFFER;
		spec.attribs[1].usage					= gls::DrawTestSpec::USAGE_STATIC_DRAW;
		spec.attribs[1].componentCount			= 2;
		spec.attribs[1].offset					= 0;
		spec.attribs[1].stride					= 0;
		spec.attribs[1].normalize				= false;
		spec.attribs[1].instanceDivisor			= 0;
		spec.attribs[1].useDefaultAttribute		= false;

		addTestIterations(test, spec, TYPE_DRAW_COUNT);

		this->addChild(test);
	}

	// Multiple attribute, second one divided
	{
		gls::DrawTest*		test					= new gls::DrawTest(m_testCtx, m_context.getRenderContext(), "instanced_attributes", "Instanced attribute array.");
		gls::DrawTestSpec	spec;

		spec.apiType								= glu::ApiType::es(3,1);
		spec.primitive								= m_primitive;
		spec.primitiveCount							= 5;
		spec.drawMethod								= m_method;
		spec.indexType								= m_indexType;
		spec.indexPointerOffset						= 0;
		spec.indexStorage							= m_indexStorage;
		spec.first									= 0;
		spec.indexMin								= 0;
		spec.indexMax								= 0;
		spec.instanceCount							= 1;
		spec.indirectOffset							= 0;

		spec.attribs.resize(3);

		spec.attribs[0].inputType					= gls::DrawTestSpec::INPUTTYPE_FLOAT;
		spec.attribs[0].outputType					= gls::DrawTestSpec::OUTPUTTYPE_VEC2;
		spec.attribs[0].storage						= gls::DrawTestSpec::STORAGE_BUFFER;
		spec.attribs[0].usage						= gls::DrawTestSpec::USAGE_STATIC_DRAW;
		spec.attribs[0].componentCount				= 4;
		spec.attribs[0].offset						= 0;
		spec.attribs[0].stride						= 0;
		spec.attribs[0].normalize					= false;
		spec.attribs[0].instanceDivisor				= 0;
		spec.attribs[0].useDefaultAttribute			= false;

		// Add another position component so the instances wont be drawn on each other
		spec.attribs[1].inputType					= gls::DrawTestSpec::INPUTTYPE_FLOAT;
		spec.attribs[1].outputType					= gls::DrawTestSpec::OUTPUTTYPE_VEC2;
		spec.attribs[1].storage						= gls::DrawTestSpec::STORAGE_BUFFER;
		spec.attribs[1].usage						= gls::DrawTestSpec::USAGE_STATIC_DRAW;
		spec.attribs[1].componentCount				= 2;
		spec.attribs[1].offset						= 0;
		spec.attribs[1].stride						= 0;
		spec.attribs[1].normalize					= false;
		spec.attribs[1].instanceDivisor				= 1;
		spec.attribs[1].useDefaultAttribute			= false;
		spec.attribs[1].additionalPositionAttribute	= true;

		// Instanced color
		spec.attribs[2].inputType					= gls::DrawTestSpec::INPUTTYPE_FLOAT;
		spec.attribs[2].outputType					= gls::DrawTestSpec::OUTPUTTYPE_VEC2;
		spec.attribs[2].storage						= gls::DrawTestSpec::STORAGE_BUFFER;
		spec.attribs[2].usage						= gls::DrawTestSpec::USAGE_STATIC_DRAW;
		spec.attribs[2].componentCount				= 3;
		spec.attribs[2].offset						= 0;
		spec.attribs[2].stride						= 0;
		spec.attribs[2].normalize					= false;
		spec.attribs[2].instanceDivisor				= 1;
		spec.attribs[2].useDefaultAttribute			= false;

		addTestIterations(test, spec, TYPE_INSTANCE_COUNT);

		this->addChild(test);
	}

	// Multiple attribute, second one default
	{
		gls::DrawTest*		test				= new gls::DrawTest(m_testCtx, m_context.getRenderContext(), "default_attribute", "Attribute specified with glVertexAttrib*.");
		gls::DrawTestSpec	spec;

		spec.apiType							= glu::ApiType::es(3,1);
		spec.primitive							= m_primitive;
		spec.primitiveCount						= 5;
		spec.drawMethod							= m_method;
		spec.indexType							= m_indexType;
		spec.indexPointerOffset					= 0;
		spec.indexStorage						= m_indexStorage;
		spec.first								= 0;
		spec.indexMin							= 0;
		spec.indexMax							= 0;
		spec.instanceCount						= 1;
		spec.indirectOffset						= 0;

		spec.attribs.resize(2);

		spec.attribs[0].inputType				= gls::DrawTestSpec::INPUTTYPE_FLOAT;
		spec.attribs[0].outputType				= gls::DrawTestSpec::OUTPUTTYPE_VEC2;
		spec.attribs[0].storage					= gls::DrawTestSpec::STORAGE_BUFFER;
		spec.attribs[0].usage					= gls::DrawTestSpec::USAGE_STATIC_DRAW;
		spec.attribs[0].componentCount			= 2;
		spec.attribs[0].offset					= 0;
		spec.attribs[0].stride					= 0;
		spec.attribs[0].normalize				= false;
		spec.attribs[0].instanceDivisor			= 0;
		spec.attribs[0].useDefaultAttribute		= false;

		struct IOPair
		{
			gls::DrawTestSpec::InputType  input;
			gls::DrawTestSpec::OutputType output;
			int							  componentCount;
		} iopairs[] =
		{
			{ gls::DrawTestSpec::INPUTTYPE_FLOAT,        gls::DrawTestSpec::OUTPUTTYPE_VEC2,  4 },
			{ gls::DrawTestSpec::INPUTTYPE_FLOAT,        gls::DrawTestSpec::OUTPUTTYPE_VEC4,  2 },
			{ gls::DrawTestSpec::INPUTTYPE_INT,          gls::DrawTestSpec::OUTPUTTYPE_IVEC3, 4 },
			{ gls::DrawTestSpec::INPUTTYPE_UNSIGNED_INT, gls::DrawTestSpec::OUTPUTTYPE_UVEC2, 4 },
		};

		for (int ioNdx = 0; ioNdx < DE_LENGTH_OF_ARRAY(iopairs); ++ioNdx)
		{
			const std::string desc = gls::DrawTestSpec::inputTypeToString(iopairs[ioNdx].input) + de::toString(iopairs[ioNdx].componentCount) + " to " + gls::DrawTestSpec::outputTypeToString(iopairs[ioNdx].output);

			spec.attribs[1].inputType			= iopairs[ioNdx].input;
			spec.attribs[1].outputType			= iopairs[ioNdx].output;
			spec.attribs[1].storage				= gls::DrawTestSpec::STORAGE_BUFFER;
			spec.attribs[1].usage				= gls::DrawTestSpec::USAGE_STATIC_DRAW;
			spec.attribs[1].componentCount		= iopairs[ioNdx].componentCount;
			spec.attribs[1].offset				= 0;
			spec.attribs[1].stride				= 0;
			spec.attribs[1].normalize			= false;
			spec.attribs[1].instanceDivisor		= 0;
			spec.attribs[1].useDefaultAttribute	= true;

			test->addIteration(spec, desc.c_str());
		}

		this->addChild(test);
	}
}